

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O3

void __thiscall CFFEmbeddedFontWriter::~CFFEmbeddedFontWriter(CFFEmbeddedFontWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->mOptionalEmbeddedPostscript)._M_dataplus._M_p;
  paVar1 = &(this->mOptionalEmbeddedPostscript).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  OutputStringBufferStream::~OutputStringBufferStream(&this->mFontFileStream);
  CFFPrimitiveWriter::~CFFPrimitiveWriter(&this->mPrimitivesWriter);
  InputFile::~InputFile(&this->mOpenTypeFile);
  OpenTypeFileInput::~OpenTypeFileInput(&this->mOpenTypeInput);
  return;
}

Assistant:

CFFEmbeddedFontWriter::~CFFEmbeddedFontWriter(void)
{
}